

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::shapeAssignTest<false>(ViewTest *this)

{
  undefined8 uVar1;
  bool bVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  size_t sVar4;
  reference piVar5;
  size_t sVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  unsigned_long *puVar8;
  logic_error *plVar9;
  long lVar10;
  code *pcVar11;
  bool bVar12;
  value_type *__val;
  ulong uVar13;
  ulong uVar14;
  undefined *puVar15;
  ulong uVar16;
  value_type *__val_2;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator_type local_91;
  undefined1 local_90 [16];
  size_t *local_80;
  size_t *local_78;
  size_t *local_70;
  size_t local_68;
  size_t local_60;
  CoordinateOrder local_58;
  bool local_54;
  int *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  int *local_40;
  unsigned_long *local_38;
  
  local_90._0_8_ = this;
  local_80 = (size_t *)operator_new(0);
  local_68 = 0;
  local_60 = 1;
  local_58 = LastMajorOrder;
  local_54 = true;
  local_78 = local_80;
  local_70 = local_80;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
  local_50 = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )0x0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )0x0,local_50,&andres::defaultOrder,&andres::defaultOrder,&local_91);
  if ((ViewTest *)local_90._0_8_ == (ViewTest *)0x0) {
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
    pcVar11 = std::runtime_error::~runtime_error;
    puVar15 = &std::runtime_error::typeinfo;
  }
  else {
    if ((local_68 == 0) && (local_60 == 1)) {
      operator_delete(local_80,0);
      local_90._0_8_ = this;
      local_80 = (size_t *)operator_new(0);
      local_68 = 0;
      local_60 = 1;
      local_58 = LastMajorOrder;
      local_54 = true;
      local_78 = local_80;
      local_70 = local_80;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      andres::View<int,false,std::allocator<unsigned_long>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,false,std::allocator<unsigned_long>> *)local_90,_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),local_50,&andres::defaultOrder,&andres::defaultOrder,
                 &local_91);
      if ((ViewTest *)local_90._0_8_ == (ViewTest *)0x0) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
        pcVar11 = std::runtime_error::~runtime_error;
        puVar15 = &std::runtime_error::typeinfo;
      }
      else {
        if ((local_68 == 1) && (local_60 == 0x18)) {
          sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,0);
          if (sVar4 != *_Var3._M_current) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          if (local_60 != 0) {
            sVar4 = 0;
            do {
              piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                 ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,sVar4
                                 );
              if (*piVar5 != local_50[sVar4]) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar4 = sVar4 + 1;
            } while (sVar4 < local_60);
          }
          operator_delete(_Var3._M_current,8);
          operator_delete(local_80,local_68 * 0x18);
          local_90._0_8_ = this;
          local_80 = (size_t *)operator_new(0);
          local_68 = 0;
          local_60 = 1;
          local_58 = LastMajorOrder;
          local_54 = true;
          local_78 = local_80;
          local_70 = local_80;
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
          _Var3._M_current = (unsigned_long *)operator_new(0x10);
          *_Var3._M_current = 6;
          _Var3._M_current[1] = 4;
          andres::View<int,false,std::allocator<unsigned_long>>::
          assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((View<int,false,std::allocator<unsigned_long>> *)local_90,_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 2),local_50,&andres::defaultOrder,&andres::defaultOrder,
                     &local_91);
          if ((ViewTest *)local_90._0_8_ == (ViewTest *)0x0) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
            pcVar11 = std::runtime_error::~runtime_error;
            puVar15 = &std::runtime_error::typeinfo;
          }
          else {
            if ((local_68 == 2) && (local_60 == 0x18)) {
              sVar4 = 0;
              bVar2 = true;
              do {
                bVar12 = bVar2;
                sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,
                                   sVar4);
                if (sVar6 != _Var3._M_current[sVar4]) {
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar9,"test failed.");
                  __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                sVar4 = 1;
                bVar2 = false;
              } while (bVar12);
              uVar16 = 0;
              while( true ) {
                sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,0);
                if (sVar4 <= uVar16) break;
                uVar13 = 0;
                while( true ) {
                  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,1)
                  ;
                  if (sVar4 <= uVar13) break;
                  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)local_90,
                                      uVar16,uVar13);
                  lVar10 = *_Var3._M_current * uVar13;
                  uVar13 = uVar13 + 1;
                  if (*piVar5 != local_50[lVar10 + uVar16]) {
                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar9,"test failed.");
                    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                }
                uVar16 = uVar16 + 1;
              }
              operator_delete(_Var3._M_current,0x10);
              operator_delete(local_80,local_68 * 0x18);
              local_90._0_8_ = this;
              local_80 = (size_t *)operator_new(0);
              local_68 = 0;
              local_60 = 1;
              local_58 = LastMajorOrder;
              local_54 = true;
              local_78 = local_80;
              local_70 = local_80;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
              local_48._M_current = (unsigned_long *)operator_new(0x18);
              *local_48._M_current = 2;
              local_48._M_current[1] = 4;
              local_48._M_current[2] = 3;
              local_40 = this->data2x_;
              andres::View<int,false,std::allocator<unsigned_long>>::
              assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,false,std::allocator<unsigned_long>> *)local_90,local_48,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(local_48._M_current + 3),local_40,&andres::defaultOrder,
                         &andres::defaultOrder,&local_91);
              if ((ViewTest *)local_90._0_8_ == (ViewTest *)0x0) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                pcVar11 = std::runtime_error::~runtime_error;
                puVar15 = &std::runtime_error::typeinfo;
              }
              else {
                if ((local_68 == 3) && (local_60 == 0x18)) {
                  sVar4 = 0;
                  do {
                    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,
                                       sVar4);
                    if (sVar6 != local_48._M_current[sVar4]) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error)
                      ;
                    }
                    sVar4 = sVar4 + 1;
                  } while (sVar4 != 3);
                  if (local_60 != 0) {
                    sVar4 = 0;
                    do {
                      piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                          local_90,sVar4);
                      if (*piVar5 != local_40[sVar4]) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      sVar4 = sVar4 + 1;
                    } while (sVar4 < local_60);
                  }
                  uVar16 = 0;
                  do {
                    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,
                                       0);
                    if (sVar4 <= uVar16) {
                      operator_delete(local_48._M_current,0x18);
                      operator_delete(local_80,local_68 * 0x18);
                      _Var3._M_current = (unsigned_long *)operator_new(8);
                      *_Var3._M_current = 0x18;
                      local_90._0_8_ = local_50;
                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var3,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                 &andres::defaultOrder,(allocator_type *)&local_91);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
                      andres::View<int,false,std::allocator<unsigned_long>>::
                      assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((View<int,false,std::allocator<unsigned_long>> *)local_90,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )0x0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        )0x0,local_50,&andres::defaultOrder,&andres::defaultOrder,
                                 &local_91);
                      if ((int *)local_90._0_8_ == (int *)0x0) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar9,"Assertion failed.");
                        pcVar11 = std::runtime_error::~runtime_error;
                        puVar15 = &std::runtime_error::typeinfo;
                      }
                      else {
                        if ((local_68 == 0) && (local_60 == 1)) {
                          operator_delete(local_80,0);
                          operator_delete(_Var3._M_current,8);
                          _Var3._M_current = (unsigned_long *)operator_new(8);
                          *_Var3._M_current = 0x18;
                          local_90._0_8_ = local_50;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var3
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var3._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_91);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
                          andres::View<int,false,std::allocator<unsigned_long>>::
                          assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((View<int,false,std::allocator<unsigned_long>> *)local_90,_Var3
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var3._M_current + 1),local_40,&andres::defaultOrder,
                                     &andres::defaultOrder,&local_91);
                          if ((int *)local_90._0_8_ == (int *)0x0) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                            pcVar11 = std::runtime_error::~runtime_error;
                            puVar15 = &std::runtime_error::typeinfo;
                          }
                          else {
                            if ((local_68 == 1) && (local_60 == 0x18)) {
                              sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      shape((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_90,0);
                              if (sVar4 != *_Var3._M_current) {
                                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar9,"test failed.");
                                __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                            std::logic_error::~logic_error);
                              }
                              if (local_60 != 0) {
                                sVar4 = 0;
                                do {
                                  piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>
                                           ::operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                  if (*piVar5 != local_40[sVar4]) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  sVar4 = sVar4 + 1;
                                } while (sVar4 < local_60);
                              }
                              operator_delete(local_80,local_68 * 0x18);
                              operator_delete(_Var3._M_current,8);
                              _Var3._M_current = (unsigned_long *)operator_new(8);
                              *_Var3._M_current = 0;
                              _Var7._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var3._M_current = 0x18;
                              *_Var7._M_current = 6;
                              _Var7._M_current[1] = 4;
                              local_90._0_8_ = local_50;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),
                                         _Var3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var3._M_current + 1),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_91);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_90);
                              andres::View<int,false,std::allocator<unsigned_long>>::
                              assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((View<int,false,std::allocator<unsigned_long>> *)local_90,
                                         _Var7,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var7._M_current + 2),local_40,
                                         &andres::defaultOrder,&andres::defaultOrder,&local_91);
                              if ((int *)local_90._0_8_ == (int *)0x0) {
                                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar9,"Assertion failed.");
                                pcVar11 = std::runtime_error::~runtime_error;
                                puVar15 = &std::runtime_error::typeinfo;
                              }
                              else {
                                if ((local_68 == 2) && (local_60 == 0x18)) {
                                  sVar4 = 0;
                                  bVar2 = true;
                                  do {
                                    bVar12 = bVar2;
                                    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>
                                            ::shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                    if (sVar6 != _Var7._M_current[sVar4]) {
                                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar9,"test failed.");
                                      __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                  std::logic_error::~logic_error);
                                    }
                                    sVar4 = 1;
                                    bVar2 = false;
                                  } while (bVar12);
                                  if (local_60 != 0) {
                                    sVar4 = 0;
                                    do {
                                      piVar5 = andres::
                                               View<int,_false,_std::allocator<unsigned_long>_>::
                                               operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                      if (*piVar5 != local_40[sVar4]) {
                                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar9,"test failed.");
                                        __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                    std::logic_error::~logic_error);
                                      }
                                      sVar4 = sVar4 + 1;
                                    } while (sVar4 < local_60);
                                  }
                                  uVar16 = 0;
                                  while( true ) {
                                    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>
                                            ::shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                    if (sVar4 <= uVar16) break;
                                    uVar13 = 0;
                                    while( true ) {
                                      sVar4 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                      if (sVar4 <= uVar13) break;
                                      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>
                                               ::operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,uVar16,uVar13);
                                      lVar10 = *_Var7._M_current * uVar13;
                                      uVar13 = uVar13 + 1;
                                      if (*piVar5 != local_40[lVar10 + uVar16]) {
                                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar9,"test failed.");
                                        __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                    std::logic_error::~logic_error);
                                      }
                                    }
                                    uVar16 = uVar16 + 1;
                                  }
                                  operator_delete(local_80,local_68 * 0x18);
                                  operator_delete(_Var7._M_current,0x10);
                                  operator_delete(_Var3._M_current,8);
                                  _Var3._M_current = (unsigned_long *)operator_new(8);
                                  *_Var3._M_current = 0;
                                  local_38 = _Var3._M_current;
                                  local_48._M_current = (unsigned_long *)operator_new(0x18);
                                  *_Var3._M_current = 0x18;
                                  *local_48._M_current = 2;
                                  local_48._M_current[1] = 4;
                                  local_48._M_current[2] = 3;
                                  local_90._0_8_ = local_50;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_90 + 8),_Var3,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var3._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_91);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_90);
                                  andres::View<int,false,std::allocator<unsigned_long>>::
                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((View<int,false,std::allocator<unsigned_long>> *)
                                             local_90,local_48,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(local_48._M_current + 3),local_40,
                                             &andres::defaultOrder,&andres::defaultOrder,&local_91);
                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar9,"Assertion failed.");
                                    pcVar11 = std::runtime_error::~runtime_error;
                                    puVar15 = &std::runtime_error::typeinfo;
                                  }
                                  else {
                                    if ((local_68 == 3) && (local_60 == 0x18)) {
                                      sVar4 = 0;
                                      do {
                                        sVar6 = andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                        if (sVar6 != local_48._M_current[sVar4]) {
                                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar9,"test failed.");
                                          __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                      std::logic_error::~logic_error);
                                        }
                                        sVar4 = sVar4 + 1;
                                      } while (sVar4 != 3);
                                      if (local_60 != 0) {
                                        sVar4 = 0;
                                        do {
                                          piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                          if (*piVar5 != local_40[sVar4]) {
                                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar9,"test failed.");
                                            __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          sVar4 = sVar4 + 1;
                                        } while (sVar4 < local_60);
                                      }
                                      uVar16 = 0;
                                      do {
                                        sVar4 = andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                        if (sVar4 <= uVar16) {
                                          operator_delete(local_80,local_68 * 0x18);
                                          operator_delete(local_48._M_current,0x18);
                                          operator_delete(local_38,8);
                                          _Var3._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var3._M_current = 6;
                                          _Var3._M_current[1] = 4;
                                          local_90._0_8_ = local_50;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     (local_90 + 8),_Var3,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                          ;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                          andres::View<int,false,std::allocator<unsigned_long>>::
                                          assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((View<int,false,std::allocator<unsigned_long>>
                                                      *)local_90,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,local_50,&andres::defaultOrder,
                                                  &andres::defaultOrder,&local_91);
                                          if ((int *)local_90._0_8_ == (int *)0x0) {
                                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar9,"Assertion failed.");
                                            pcVar11 = std::runtime_error::~runtime_error;
                                            puVar15 = &std::runtime_error::typeinfo;
                                          }
                                          else {
                                            if ((local_68 == 0) && (local_60 == 1)) {
                                              operator_delete(local_80,0);
                                              operator_delete(_Var3._M_current,0x10);
                                              _Var3._M_current = (unsigned_long *)operator_new(0x10)
                                              ;
                                              *_Var3._M_current = 0;
                                              _Var3._M_current[1] = 0;
                                              _Var7._M_current = (unsigned_long *)operator_new(8);
                                              *_Var3._M_current = 6;
                                              _Var3._M_current[1] = 4;
                                              *_Var7._M_current = 0x18;
                                              local_90._0_8_ = local_50;
                                              andres::marray_detail::
                                              Geometry<std::allocator<unsigned_long>>::
                                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Geometry<std::allocator<unsigned_long>> *)
                                                         (local_90 + 8),_Var3,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                              ;
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                              andres::View<int,false,std::allocator<unsigned_long>>
                                              ::
                                              assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),local_40,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                              if ((int *)local_90._0_8_ == (int *)0x0) {
                                                plVar9 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar9,
                                                           "Assertion failed.");
                                                pcVar11 = std::runtime_error::~runtime_error;
                                                puVar15 = &std::runtime_error::typeinfo;
                                              }
                                              else {
                                                if ((local_68 == 1) && (local_60 == 0x18)) {
                                                  sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 != *_Var7._M_current) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_60 != 0) {
                                                    sVar4 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (*piVar5 != local_40[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 < local_60);
                                                  }
                                                  operator_delete(local_80,local_68 * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(_Var3._M_current,0x10);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var3._M_current = 6;
                                                  _Var3._M_current[1] = 4;
                                                  local_90._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 2),local_40,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if ((local_68 == 2) && (local_60 == 0x18)) {
                                                      sVar4 = 0;
                                                      bVar2 = true;
                                                      do {
                                                        bVar12 = bVar2;
                                                        sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (sVar6 != _Var3._M_current[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = 1;
                                                  bVar2 = false;
                                                  } while (bVar12);
                                                  uVar16 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 <= uVar16) break;
                                                  uVar13 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                                  if (sVar4 <= uVar13) break;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,uVar16,uVar13);
                                                  lVar10 = *_Var3._M_current * uVar13;
                                                  uVar13 = uVar13 + 1;
                                                  if (*piVar5 != local_40[lVar10 + uVar16]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar16 = uVar16 + 1;
                                                  }
                                                  operator_delete(local_80,local_68 * 0x18);
                                                  operator_delete(_Var3._M_current,0x10);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var3._M_current = 0;
                                                  _Var3._M_current[1] = 0;
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 4;
                                                  _Var7._M_current[1] = 6;
                                                  *_Var3._M_current = 6;
                                                  _Var3._M_current[1] = 4;
                                                  local_90._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 2),local_40,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if ((local_68 == 2) && (local_60 == 0x18)) {
                                                      sVar4 = 0;
                                                      bVar2 = true;
                                                      do {
                                                        bVar12 = bVar2;
                                                        sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (sVar6 != _Var3._M_current[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = 1;
                                                  bVar2 = false;
                                                  } while (bVar12);
                                                  uVar16 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 <= uVar16) break;
                                                  uVar13 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                                  if (sVar4 <= uVar13) break;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,uVar16,uVar13);
                                                  lVar10 = *_Var3._M_current * uVar13;
                                                  uVar13 = uVar13 + 1;
                                                  if (*piVar5 != local_40[lVar10 + uVar16]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar16 = uVar16 + 1;
                                                  }
                                                  operator_delete(local_80,local_68 * 0x18);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(_Var3._M_current,0x10);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var3._M_current = 0;
                                                  _Var3._M_current[1] = 0;
                                                  local_38 = _Var3._M_current;
                                                  local_48._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *local_48._M_current = 0;
                                                  local_48._M_current[1] = 0;
                                                  local_48._M_current[2] = 0;
                                                  *_Var3._M_current = 6;
                                                  _Var3._M_current[1] = 4;
                                                  local_90._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  *local_48._M_current = 2;
                                                  local_48._M_current[1] = 4;
                                                  local_48._M_current[2] = 3;
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,local_48,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_48._M_current + 3),local_50,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if ((local_68 == 3) && (local_60 == 0x18)) {
                                                      sVar4 = 0;
                                                      do {
                                                        sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (sVar6 != local_48._M_current[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 != 3);
                                                  if (local_60 != 0) {
                                                    sVar4 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (*piVar5 != local_50[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 < local_60);
                                                  }
                                                  uVar16 = 0;
                                                  do {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 <= uVar16) {
                                                    operator_delete(local_80,local_68 * 0x18);
                                                    operator_delete(local_48._M_current,0x18);
                                                    operator_delete(local_38,0x10);
                                                    _Var3._M_current =
                                                         (unsigned_long *)operator_new(0x18);
                                                    *_Var3._M_current = 3;
                                                    _Var3._M_current[1] = 4;
                                                    _Var3._M_current[2] = 2;
                                                    local_90._0_8_ = local_50;
                                                    andres::marray_detail::
                                                    Geometry<std::allocator<unsigned_long>>::
                                                                                                        
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,local_50,&andres::defaultOrder,
                                                  &andres::defaultOrder,&local_91);
                                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if ((local_68 == 0) && (local_60 == 1)) {
                                                      operator_delete(local_80,0);
                                                      operator_delete(_Var3._M_current,0x18);
                                                      _Var3._M_current =
                                                           (unsigned_long *)operator_new(0x18);
                                                      *_Var3._M_current = 0;
                                                      _Var3._M_current[1] = 0;
                                                      _Var3._M_current[2] = 0;
                                                      _Var7._M_current =
                                                           (unsigned_long *)operator_new(8);
                                                      *_Var3._M_current = 3;
                                                      _Var3._M_current[1] = 4;
                                                      _Var3._M_current[2] = 2;
                                                      *_Var7._M_current = 0x18;
                                                      local_90._0_8_ = local_50;
                                                      andres::marray_detail::
                                                      Geometry<std::allocator<unsigned_long>>::
                                                                                                            
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),local_40,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if ((local_68 == 1) && (local_60 == 0x18)) {
                                                      sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 != *_Var7._M_current) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_60 != 0) {
                                                    sVar4 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (*piVar5 != local_40[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 < local_60);
                                                  }
                                                  operator_delete(local_80,local_68 * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(_Var3._M_current,0x18);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var3._M_current = 0;
                                                  _Var3._M_current[1] = 0;
                                                  _Var3._M_current[2] = 0;
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 0;
                                                  _Var7._M_current[1] = 0;
                                                  *_Var3._M_current = 2;
                                                  _Var3._M_current[1] = 4;
                                                  _Var3._M_current[2] = 3;
                                                  local_90._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  *_Var7._M_current = 6;
                                                  _Var7._M_current[1] = 4;
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),local_50,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  if ((int *)local_90._0_8_ == (int *)0x0) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if ((local_68 == 2) && (local_60 == 0x18)) {
                                                      sVar4 = 0;
                                                      bVar2 = true;
                                                      do {
                                                        bVar12 = bVar2;
                                                        sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (sVar6 != _Var7._M_current[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = 1;
                                                  bVar2 = false;
                                                  } while (bVar12);
                                                  if (local_60 != 0) {
                                                    sVar4 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (*piVar5 != local_50[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 < local_60);
                                                  }
                                                  uVar16 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 <= uVar16) break;
                                                  uVar13 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                                  if (sVar4 <= uVar13) break;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,uVar16,uVar13);
                                                  lVar10 = *_Var7._M_current * uVar13;
                                                  uVar13 = uVar13 + 1;
                                                  if (*piVar5 != local_50[lVar10 + uVar16]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar16 = uVar16 + 1;
                                                  }
                                                  operator_delete(local_80,local_68 * 0x18);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(_Var3._M_current,0x18);
                                                  local_48._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var3._M_current = local_48._M_current + 3;
                                                  *local_48._M_current = 2;
                                                  local_48._M_current[1] = 4;
                                                  local_48._M_current[2] = 3;
                                                  local_90._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),local_48,_Var3,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  (allocator_type *)&local_91);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,local_48,_Var3,local_40,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  sVar4 = 0;
                                                  do {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (sVar6 != local_48._M_current[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 != 3);
                                                  if (local_60 != 0) {
                                                    sVar4 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (*piVar5 != local_40[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 < local_60);
                                                  }
                                                  uVar16 = 0;
                                                  do {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 <= uVar16) {
                                                    operator_delete(local_80,local_68 * 0x18);
                                                    operator_delete(local_48._M_current,0x18);
                                                    puVar8 = (unsigned_long *)operator_new(0x18);
                                                    *puVar8 = 0;
                                                    puVar8[1] = 0;
                                                    puVar8[2] = 0;
                                                    local_48._M_current = puVar8;
                                                    _Var3._M_current =
                                                         (unsigned_long *)operator_new(0x18);
                                                    *_Var3._M_current = 3;
                                                    _Var3._M_current[1] = 2;
                                                    _Var3._M_current[2] = 4;
                                                    *puVar8 = 2;
                                                    puVar8[1] = 4;
                                                    puVar8[2] = 3;
                                                    local_90._0_8_ = local_50;
                                                    local_50 = (int *)_Var3._M_current;
                                                    andres::marray_detail::
                                                    Geometry<std::allocator<unsigned_long>>::
                                                                                                        
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_90 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_91)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_90,local_48,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_48._M_current + 3),local_40,
                                                  &andres::defaultOrder,&andres::defaultOrder,
                                                  &local_91);
                                                  sVar4 = 0;
                                                  do {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (sVar6 != local_48._M_current[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 != 3);
                                                  if (local_60 != 0) {
                                                    sVar4 = 0;
                                                    do {
                                                      piVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,sVar4);
                                                  if (*piVar5 != local_40[sVar4]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar4 = sVar4 + 1;
                                                  } while (sVar4 < local_60);
                                                  }
                                                  uVar16 = 0;
                                                  do {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  if (sVar4 <= uVar16) {
                                                    operator_delete(local_80,local_68 * 0x18);
                                                    operator_delete(local_50,0x18);
                                                    operator_delete(local_48._M_current,0x18);
                                                    return;
                                                  }
                                                  uVar13 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                                  if (sVar4 <= uVar13) break;
                                                  uVar14 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,2);
                                                  if (sVar4 <= uVar14) break;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  uVar1 = local_90._0_8_;
                                                  if (((int *)local_90._0_8_ == (int *)0x0) ||
                                                     (local_68 != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                    goto LAB_0015608f;
                                                  }
                                                  sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,3,uVar13,uVar14);
                                                  lVar10 = local_48._M_current[1] * uVar14;
                                                  uVar14 = uVar14 + 1;
                                                  if (*(int *)(uVar1 + (sVar4 * uVar16 + sVar6) * 4)
                                                      != local_40[(lVar10 + uVar13) *
                                                                  *local_48._M_current + uVar16]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar11 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
LAB_0015608f:
                                                    __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  }
                                                  uVar13 = uVar13 + 1;
                                                  }
                                                  uVar16 = uVar16 + 1;
                                                  } while( true );
                                                  }
                                                  uVar13 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                                  if (sVar4 <= uVar13) break;
                                                  uVar14 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,2);
                                                  if (sVar4 <= uVar14) break;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  uVar1 = local_90._0_8_;
                                                  if (((int *)local_90._0_8_ == (int *)0x0) ||
                                                     (local_68 != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                    goto LAB_00156031;
                                                  }
                                                  sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,3,uVar13,uVar14);
                                                  lVar10 = local_48._M_current[1] * uVar14;
                                                  uVar14 = uVar14 + 1;
                                                  if (*(int *)(uVar1 + (sVar4 * uVar16 + sVar6) * 4)
                                                      != local_40[(lVar10 + uVar13) *
                                                                  *local_48._M_current + uVar16]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar11 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
LAB_00156031:
                                                    __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  }
                                                  uVar13 = uVar13 + 1;
                                                  }
                                                  uVar16 = uVar16 + 1;
                                                  } while( true );
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar11 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar11 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar11 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  uVar13 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                                  if (sVar4 <= uVar13) break;
                                                  uVar14 = 0;
                                                  while( true ) {
                                                    sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,2);
                                                  if (sVar4 <= uVar14) break;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                                  uVar1 = local_90._0_8_;
                                                  if (((int *)local_90._0_8_ == (int *)0x0) ||
                                                     (local_68 != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar11 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
                                                    goto LAB_00155fd3;
                                                  }
                                                  sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,3,uVar13,uVar14);
                                                  lVar10 = local_48._M_current[1] * uVar14;
                                                  uVar14 = uVar14 + 1;
                                                  if (*(int *)(uVar1 + (sVar4 * uVar16 + sVar6) * 4)
                                                      != local_50[(lVar10 + uVar13) *
                                                                  *local_48._M_current + uVar16]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar11 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
LAB_00155fd3:
                                                    __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  }
                                                  uVar13 = uVar13 + 1;
                                                  }
                                                  uVar16 = uVar16 + 1;
                                                  } while( true );
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar11 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar11 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar11 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                                }
                                                plVar9 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar9,"test failed.")
                                                ;
                                                pcVar11 = std::logic_error::~logic_error;
                                                puVar15 = &std::logic_error::typeinfo;
                                              }
                                              __cxa_throw(plVar9,puVar15,pcVar11);
                                            }
                                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar9,"test failed.");
                                            pcVar11 = std::logic_error::~logic_error;
                                            puVar15 = &std::logic_error::typeinfo;
                                          }
                                          __cxa_throw(plVar9,puVar15,pcVar11);
                                        }
                                        uVar13 = 0;
                                        while( true ) {
                                          sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,1);
                                          if (sVar4 <= uVar13) break;
                                          uVar14 = 0;
                                          while( true ) {
                                            sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,2);
                                            if (sVar4 <= uVar14) break;
                                            andres::View<int,_false,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90);
                                            uVar1 = local_90._0_8_;
                                            if (((int *)local_90._0_8_ == (int *)0x0) ||
                                               (local_68 != 3)) {
                                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar9,"Assertion failed."
                                                        );
                                              pcVar11 = std::runtime_error::~runtime_error;
                                              puVar15 = &std::runtime_error::typeinfo;
                                              goto LAB_00155f75;
                                            }
                                            sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,0);
                                            sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_90,3,uVar13,uVar14);
                                            lVar10 = local_48._M_current[1] * uVar14;
                                            uVar14 = uVar14 + 1;
                                            if (*(int *)(uVar1 + (sVar4 * uVar16 + sVar6) * 4) !=
                                                local_40[(lVar10 + uVar13) * *local_48._M_current +
                                                         uVar16]) {
                                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar9,"test failed.");
                                              pcVar11 = std::logic_error::~logic_error;
                                              puVar15 = &std::logic_error::typeinfo;
LAB_00155f75:
                                              __cxa_throw(plVar9,puVar15,pcVar11);
                                            }
                                          }
                                          uVar13 = uVar13 + 1;
                                        }
                                        uVar16 = uVar16 + 1;
                                      } while( true );
                                    }
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    pcVar11 = std::logic_error::~logic_error;
                                    puVar15 = &std::logic_error::typeinfo;
                                  }
                                  __cxa_throw(plVar9,puVar15,pcVar11);
                                }
                                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar9,"test failed.");
                                pcVar11 = std::logic_error::~logic_error;
                                puVar15 = &std::logic_error::typeinfo;
                              }
                              __cxa_throw(plVar9,puVar15,pcVar11);
                            }
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar9,"test failed.");
                            pcVar11 = std::logic_error::~logic_error;
                            puVar15 = &std::logic_error::typeinfo;
                          }
                          __cxa_throw(plVar9,puVar15,pcVar11);
                        }
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        pcVar11 = std::logic_error::~logic_error;
                        puVar15 = &std::logic_error::typeinfo;
                      }
                      __cxa_throw(plVar9,puVar15,pcVar11);
                    }
                    uVar13 = 0;
                    while( true ) {
                      sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                        ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_90,1);
                      if (sVar4 <= uVar13) break;
                      uVar14 = 0;
                      while( true ) {
                        sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_90,2);
                        if (sVar4 <= uVar14) break;
                        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
                        uVar1 = local_90._0_8_;
                        if (((ViewTest *)local_90._0_8_ == (ViewTest *)0x0) || (local_68 != 3)) {
                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar9,"Assertion failed.");
                          pcVar11 = std::runtime_error::~runtime_error;
                          puVar15 = &std::runtime_error::typeinfo;
                          goto LAB_00155f17;
                        }
                        sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_90,0);
                        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                elementAccessHelper<unsigned_long>
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_90,3,uVar13,uVar14);
                        lVar10 = local_48._M_current[1] * uVar14;
                        uVar14 = uVar14 + 1;
                        if (((int *)(uVar1 + 4))[sVar4 * uVar16 + (sVar6 - 1)] !=
                            local_40[(lVar10 + uVar13) * *local_48._M_current + uVar16]) {
                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar9,"test failed.");
                          pcVar11 = std::logic_error::~logic_error;
                          puVar15 = &std::logic_error::typeinfo;
LAB_00155f17:
                          __cxa_throw(plVar9,puVar15,pcVar11);
                        }
                      }
                      uVar13 = uVar13 + 1;
                    }
                    uVar16 = uVar16 + 1;
                  } while( true );
                }
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                pcVar11 = std::logic_error::~logic_error;
                puVar15 = &std::logic_error::typeinfo;
              }
              __cxa_throw(plVar9,puVar15,pcVar11);
            }
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            pcVar11 = std::logic_error::~logic_error;
            puVar15 = &std::logic_error::typeinfo;
          }
          __cxa_throw(plVar9,puVar15,pcVar11);
        }
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        pcVar11 = std::logic_error::~logic_error;
        puVar15 = &std::logic_error::typeinfo;
      }
      __cxa_throw(plVar9,puVar15,pcVar11);
    }
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar9,"test failed.");
    pcVar11 = std::logic_error::~logic_error;
    puVar15 = &std::logic_error::typeinfo;
  }
  __cxa_throw(plVar9,puVar15,pcVar11);
}

Assistant:

void ViewTest::shapeAssignTest() {
    // scalar... 
    {
        // to scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(0);
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
        }
        // to 2D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data_[j+k*shape[0]]);
                }
            }
        }
        // to 3D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(3);
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
    }
    // 1D... 
    {
        // to scalar 
        { 
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
               v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape1D(1), shape2D(2);
            shape1D[0] = 24;
            shape2D[0] = 6;
            shape2D[1] = 4;
            andres::View<int, constTarget> v(shape1D.begin(), shape1D.end(), data_);
            v.assign(shape2D.begin(), shape2D.end(), data2x_);

            test(v.dimension() == shape2D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape2D.size(); ++j) {
                test(v.shape(j) == shape2D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape2D[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape1D(1), shape3D(3);
            shape1D[0] = 24;
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            andres::View<int, constTarget> v(shape1D.begin(), shape1D.end(), data_);
            v.assign(shape3D.begin(), shape3D.end(), data2x_);

            test(v.dimension() == shape3D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape3D.size(); ++j) {
                test(v.shape(j) == shape3D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape3D[0] + p*shape3D[0]*shape3D[1] ]);
                    }
                }
            }
        }
    }
    // 2D... 
    {
        // to scalar
        {
            std::vector<std::size_t> shape2D(2), shape0(0);
            shape2D[0] = 6;
            shape2D[1] = 4; 
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape2D(2), shape1D(1);
            shape2D[0] = 6;
            shape2D[1] = 4; 
            shape1D[0] = 24;
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            v.assign(shape1D.begin(), shape1D.end(), data2x_);

            test(v.dimension() == shape1D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape1D.size(); ++j) {
                test(v.shape(j) == shape1D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape[0]]);
                }
            }
        }
        // to 2D with different shape
        {
            std::vector<std::size_t> shape(2), shapeBefore(2);
            shapeBefore[0] = 4;
            shapeBefore[1] = 6;
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shapeBefore.begin(), shapeBefore.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape2D(2), shape3D(3);
            shape2D[0] = 6;
            shape2D[1] = 4;
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            v.assign(shape3D.begin(), shape3D.end(), data_);

            test(v.dimension() == shape3D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape3D.size(); ++j) {
                test(v.shape(j) == shape3D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data_[ j + k*shape3D[0] + p*shape3D[0]*shape3D[1] ]);
                    }
                }
            }
        }
    }
    // 3D...  
    {
        // to scalar
        {
            std::vector<std::size_t> shape3D(3), shape0(0);
            shape3D[0] = 3;
            shape3D[1] = 4;
            shape3D[2] = 2;
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape3D(3), shape1D(1);
            shape3D[0] = 3;
            shape3D[1] = 4;
            shape3D[2] = 2;
            shape1D[0] = 24; 
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            v.assign(shape1D.begin(), shape1D.end(), data2x_);

            test(v.dimension() == shape1D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape1D.size(); ++j) {
                test(v.shape(j) == shape1D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape3D(3), shape2D(2);
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            shape2D[0] = 6;
            shape2D[1] = 4;
            v.assign(shape2D.begin(), shape2D.end(), data_);
            
            test(v.dimension() == shape2D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape2D.size(); ++j) {
                test(v.shape(j) == shape2D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data_[j+k*shape2D[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
        // to 3D with different shape
        {
            std::vector<std::size_t> shape(3), shapeBefore(3);
            shapeBefore[0] = 3;
            shapeBefore[1] = 2;
            shapeBefore[2] = 4;
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            andres::View<int, constTarget> v(shapeBefore.begin(), shapeBefore.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
    }
}